

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O2

Am_Value_List break_up_objects(Am_Object *interp,Am_Object *orig,bool vis)

{
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Wrapper *value;
  Am_Object *pAVar6;
  Am_Constraint *pAVar7;
  char in_CL;
  int iVar8;
  undefined7 in_register_00000011;
  Am_List_Item *extraout_RDX;
  int iVar9;
  int iVar10;
  Am_Value_List AVar11;
  Am_Object win;
  int trans_top;
  int trans_left;
  double local_98;
  Am_Object from_part;
  Am_Object animator;
  Am_Object part;
  int maxobjh;
  int maxobjw;
  Am_Object local_68;
  Am_Object local_60;
  double local_58;
  double local_50;
  Am_Object *local_48;
  double local_40;
  double local_38;
  
  local_48 = orig;
  Am_Value_List::Am_Value_List((Am_Value_List *)interp);
  maxobjw = 0;
  maxobjh = 0;
  add_obj_and_parts((Am_Object *)CONCAT71(in_register_00000011,vis),(Am_Value_List *)interp,&maxobjw
                    ,&maxobjh);
  pAVar5 = Am_Object::Get((Am_Object *)CONCAT71(in_register_00000011,vis),0x68,0);
  Am_Object::Am_Object(&win,pAVar5);
  part.data = (Am_Object_Data *)0x0;
  from_part.data = (Am_Object_Data *)0x0;
  animator.data = (Am_Object_Data *)0x0;
  uVar2 = Am_Value_List::Length((Am_Value_List *)interp);
  pAVar5 = Am_Object::Get(&win,0x66,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(&win,0x67,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar5);
  iVar8 = maxobjw;
  iVar10 = maxobjh;
  Am_Value_List::Start((Am_Value_List *)interp);
  iVar9 = iVar10 + iVar4;
  if (iVar10 + iVar4 < iVar8 + iVar3) {
    iVar9 = iVar8 + iVar3;
  }
  local_58 = 6.283185307179586 / (double)uVar2;
  local_50 = (double)(iVar9 / 2 + 1);
  local_98 = 0.0;
  while( true ) {
    bVar1 = Am_Value_List::Last((Am_Value_List *)interp);
    if (bVar1) break;
    pAVar5 = Am_Value_List::Get((Am_Value_List *)interp);
    Am_Object::operator=(&part,pAVar5);
    Am_Object::Remove_From_Owner(&part);
    pAVar5 = Am_Object::Get(&part,0xc,0);
    Am_Object::operator=(&from_part,pAVar5);
    Am_Translate_Coordinates(&from_part,0,0,&win,&trans_left,&trans_top);
    local_38 = sin(local_98);
    local_40 = cos(local_98);
    Am_Object::Create(&local_60,(char *)&Am_Animator);
    Am_Object::operator=(&animator,&local_60);
    Am_Object::~Am_Object(&local_60);
    Am_Object::Get_Object(&local_60,(Am_Slot_Key)&animator,0xc5);
    value = Am_Object::operator_cast_to_Am_Wrapper_(local_48);
    pAVar6 = Am_Object::Set(&local_60,0x171,value,1);
    pAVar6 = Am_Object::Set(pAVar6,0xca,fly_apart_anim_done.from_wrapper,0);
    Am_Object::Set(pAVar6,0xc9,fly_apart_anim_done.from_wrapper,0);
    iVar10 = (int)(local_38 * local_50) + iVar3 / 2;
    iVar9 = iVar4 / 2 - (int)(local_40 * local_50);
    Am_Object::~Am_Object(&local_60);
    if (in_CL == '\0') {
      Am_Object::Set(&part,100,trans_left,0);
      iVar8 = trans_top;
    }
    else {
      Am_Object::Set(&part,100,iVar10,0);
      iVar8 = iVar9;
    }
    Am_Object::Set(&part,0x65,iVar8,0);
    Am_Object::Am_Object(&local_68,&part);
    Am_Object::Add_Part(&win,&local_68,true,0);
    Am_Object::~Am_Object(&local_68);
    pAVar7 = Am_Animate_With(&animator);
    Am_Object::Set(&part,100,pAVar7,0);
    pAVar7 = Am_Animate_With(&animator);
    Am_Object::Set(&part,0x65,pAVar7,0);
    if (in_CL == '\0') {
      Am_Object::Set(&part,100,iVar10,0);
    }
    else {
      Am_Object::Set(&part,100,trans_left,0);
      iVar9 = trans_top;
    }
    Am_Object::Set(&part,0x65,iVar9,0);
    Am_Value_List::Next((Am_Value_List *)interp);
    local_98 = local_98 + local_58;
  }
  Am_Object::~Am_Object(&animator);
  Am_Object::~Am_Object(&from_part);
  Am_Object::~Am_Object(&part);
  Am_Object::~Am_Object(&win);
  AVar11.item = extraout_RDX;
  AVar11.data = (Am_Value_List_Data *)interp;
  return AVar11;
}

Assistant:

Am_Value_List
break_up_objects(Am_Object &interp, Am_Object &orig, bool vis)
{
  Am_Value_List new_parts;
  int maxobjw = 0;
  int maxobjh = 0;
  //get flat list of all parts
  add_obj_and_parts(orig, new_parts, maxobjw, maxobjh);
  Am_INTER_TRACE_PRINT(interp, "  New parts = " << new_parts);
  Am_Object win = orig.Get(Am_WINDOW);
  Am_Object part, from_part, animator;
  int num_parts = new_parts.Length();
  int trans_left, trans_top, win_w, win_h, win_center_x, win_center_y, maxwh, x,
      y, left, top;
  win_w = win.Get(Am_WIDTH);
  win_h = win.Get(Am_HEIGHT);
  win_center_x = win_w / 2;
  win_center_y = win_h / 2;
  maxwh = imax(win_w + maxobjw, win_h + maxobjh) / 2 + 1;
  double rads_per_obj = (M_PI * 2) / num_parts;
  double rads = 0.0;
  for (new_parts.Start(); !new_parts.Last();
       new_parts.Next(), rads += rads_per_obj) {
    part = new_parts.Get();
    part.Remove_From_Owner(); //make sure not a part now
    from_part = part.Get(Am_SOURCE_OF_COPY);
    Am_Translate_Coordinates(from_part, 0, 0, win, trans_left, trans_top);
    x = (int)(maxwh * sin(rads));
    y = (int)(maxwh * cos(rads));
    left = win_center_x + x;
    top = win_center_y - y;
    animator = Am_Animator.Create();
    animator.Get_Object(Am_COMMAND)
        .Set(Am_SAVED_OLD_OBJECT_OWNER, interp, Am_OK_IF_NOT_THERE)
        .Set(Am_DO_METHOD, fly_apart_anim_done)
        .Set(Am_ABORT_DO_METHOD, fly_apart_anim_done);
    //set start location
    if (vis) { // then starts off edge
      part.Set(Am_LEFT, left);
      part.Set(Am_TOP, top);
    } else { //starts at object
      part.Set(Am_LEFT, trans_left);
      part.Set(Am_TOP, trans_top);
    }
    win.Add_Part(part);

    part.Set(Am_LEFT, Am_Animate_With(animator));
    part.Set(Am_TOP, Am_Animate_With(animator));
    if (vis) { //then goes to object
      part.Set(Am_LEFT, trans_left);
      part.Set(Am_TOP, trans_top);
    } else { // goes off edge
      part.Set(Am_LEFT, left);
      part.Set(Am_TOP, top);
    }
  }
  return new_parts;
}